

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rb_generator.cc
# Opt level: O1

void __thiscall
t_rb_generator::generate_field_defns(t_rb_generator *this,t_rb_ofstream *out,t_struct *tstruct)

{
  undefined1 *puVar1;
  pointer pcVar2;
  t_field *ptVar3;
  char *pcVar4;
  long lVar5;
  t_rb_generator *ptVar6;
  t_struct *ptVar7;
  ostream *poVar8;
  int iVar9;
  pointer pptVar10;
  long lVar11;
  char *local_80;
  long local_78;
  char local_70;
  undefined7 uStack_6f;
  undefined8 uStack_68;
  t_rb_generator *local_60;
  char *local_58;
  long local_50;
  char local_48;
  undefined7 uStack_47;
  undefined8 uStack_40;
  t_struct *local_38;
  
  if (0 < *(int *)&(out->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                   field_0xf8) {
    iVar9 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"  ",2);
      iVar9 = iVar9 + 1;
    } while (iVar9 < *(int *)&(out->super_ofstream).
                              super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"FIELDS = {",10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  puVar1 = &(out->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8;
  *(int *)puVar1 = *(int *)puVar1 + 1;
  pptVar10 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ptVar6 = this;
  ptVar7 = tstruct;
  if (pptVar10 !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      local_38 = ptVar7;
      local_60 = ptVar6;
      if (pptVar10 !=
          (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,",",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)out,::endl_abi_cxx11_._M_dataplus._M_p,
                   ::endl_abi_cxx11_._M_string_length);
      }
      generate_rdoc(this,out,&(*pptVar10)->super_t_doc);
      if (0 < *(int *)&(out->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                       field_0xf8) {
        iVar9 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"  ",2);
          iVar9 = iVar9 + 1;
        } while (iVar9 < *(int *)&(out->super_ofstream).
                                  super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8);
      }
      pcVar2 = ((*pptVar10)->name_)._M_dataplus._M_p;
      local_80 = &local_70;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_80,pcVar2,pcVar2 + ((*pptVar10)->name_)._M_string_length);
      lVar5 = local_78;
      pcVar4 = local_80;
      if (local_78 != 0) {
        lVar11 = 0;
        do {
          iVar9 = toupper((int)pcVar4[lVar11]);
          pcVar4[lVar11] = (char)iVar9;
          lVar11 = lVar11 + 1;
        } while (lVar5 != lVar11);
      }
      this = local_60;
      lVar5 = local_78;
      local_58 = &local_48;
      if (local_80 == &local_70) {
        uStack_40 = uStack_68;
      }
      else {
        local_58 = local_80;
      }
      _local_48 = CONCAT71(uStack_6f,local_70);
      local_50 = local_78;
      local_78 = 0;
      local_70 = '\0';
      local_80 = &local_70;
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,local_58,lVar5);
      tstruct = local_38;
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," => ",4);
      if (local_58 != &local_48) {
        operator_delete(local_58);
      }
      if (local_80 != &local_70) {
        operator_delete(local_80);
      }
      ptVar3 = *pptVar10;
      generate_field_data(this,out,ptVar3->type_,&ptVar3->name_,ptVar3->value_,
                          ptVar3->req_ == T_OPTIONAL);
      pptVar10 = pptVar10 + 1;
      ptVar6 = local_60;
      ptVar7 = local_38;
    } while (pptVar10 !=
             (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  puVar1 = &(out->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8;
  *(int *)puVar1 = *(int *)puVar1 + -1;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (0 < *(int *)&(out->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                   field_0xf8) {
    iVar9 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"  ",2);
      iVar9 = iVar9 + 1;
    } while (iVar9 < *(int *)&(out->super_ofstream).
                              super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"}",1);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)out,::endl_abi_cxx11_._M_dataplus._M_p,
                      ::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (0 < *(int *)&(out->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                   field_0xf8) {
    iVar9 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"  ",2);
      iVar9 = iVar9 + 1;
    } while (iVar9 < *(int *)&(out->super_ofstream).
                              super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,"def struct_fields; FIELDS; end",0x1e);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)out,::endl_abi_cxx11_._M_dataplus._M_p,
                      ::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  return;
}

Assistant:

void t_rb_generator::generate_field_defns(t_rb_ofstream& out, t_struct* tstruct) {
  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;

  out.indent() << "FIELDS = {" << endl;
  out.indent_up();
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if (f_iter != fields.begin()) {
      out << "," << endl;
    }

    // generate the field docstrings within the FIELDS constant. no real better place...
    generate_rdoc(out, *f_iter);

    out.indent() << upcase_string((*f_iter)->get_name()) << " => ";

    generate_field_data(out,
                        (*f_iter)->get_type(),
                        (*f_iter)->get_name(),
                        (*f_iter)->get_value(),
                        (*f_iter)->get_req() == t_field::T_OPTIONAL);
  }
  out.indent_down();
  out << endl;
  out.indent() << "}" << endl << endl;

  out.indent() << "def struct_fields; FIELDS; end" << endl << endl;
}